

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_queue.cpp
# Opt level: O0

ssize_t __thiscall mpt::io::queue::read(queue *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  undefined4 in_register_00000034;
  ulong local_38;
  size_t done;
  size_t part_local;
  void *d_local;
  size_t len_local;
  queue *this_local;
  
  local_38 = 0;
  part_local = (size_t)__buf;
  while( true ) {
    if (CONCAT44(in_register_00000034,__fd) <= local_38) {
      return CONCAT44(in_register_00000034,__fd);
    }
    lVar1 = mpt_qpop(&this->_d,__nbytes,part_local);
    if (lVar1 == 0) break;
    local_38 = local_38 + 1;
    part_local = part_local + __nbytes;
  }
  return local_38;
}

Assistant:

ssize_t io::queue::read(size_t len, void *d, size_t part)
{
	size_t done = 0;
	while (done < len) {
		if (!mpt_qpop(&_d, part, d)) {
			return done;
		}
		++done;
		d = ((char *) d) + part;
	}
	return len;
}